

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

Vec_Ptr_t * Bac_PtrTransformSigs(Vec_Ptr_t *vSig)

{
  int iVar1;
  char *__s;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __size;
  char *local_40;
  
  iVar1 = vSig->nSize;
  uVar5 = (ulong)iVar1;
  if (-1 < (long)uVar5) {
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nSize = 0;
    pVVar2->nCap = iVar1;
    if (iVar1 == 0) {
      pVVar2->pArray = (void **)0x0;
    }
    else {
      ppvVar3 = (void **)malloc(uVar5 << 3);
      pVVar2->pArray = ppvVar3;
      __size = 0;
      uVar7 = 0;
      uVar6 = 0;
      do {
        __s = (char *)vSig->pArray[uVar6];
        if (__s == (char *)0x0) {
          local_40 = (char *)0x0;
        }
        else {
          sVar4 = strlen(__s);
          local_40 = (char *)malloc(sVar4 + 1);
          strcpy(local_40,__s);
        }
        if ((int)uVar6 == (int)uVar5) {
          ppvVar3 = pVVar2->pArray;
          if (uVar6 < 0x10) {
            if (ppvVar3 == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(ppvVar3,0x80);
            }
            pVVar2->pArray = ppvVar3;
            uVar5 = 0x10;
          }
          else {
            if (ppvVar3 == (void **)0x0) {
              ppvVar3 = (void **)malloc(__size);
            }
            else {
              ppvVar3 = (void **)realloc(ppvVar3,__size);
            }
            pVVar2->pArray = ppvVar3;
            uVar5 = uVar7;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        ppvVar3[uVar6] = local_40;
        uVar6 = uVar6 + 1;
        uVar7 = (ulong)((int)uVar7 + 2);
        __size = __size + 0x10;
      } while ((long)uVar6 < (long)vSig->nSize);
      pVVar2->nSize = (int)uVar6;
      pVVar2->nCap = (int)uVar5;
    }
    return pVVar2;
  }
  __assert_fail("nCap >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformSigs( Vec_Ptr_t * vSig )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vSig) );
    Vec_PtrForEachEntry( char *, vSig, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    return vNew;
}